

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBarsH<int>
               (char *label_id,int *xs,int *ys,int count,double height,int offset,int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<int> getter;
  int stride_local;
  int offset_local;
  double height_local;
  int count_local;
  int *ys_local;
  int *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<int>::GetterXsYs((GetterXsYs<int> *)local_58,xs,ys,count,offset,stride);
  PlotBarsHEx<ImPlot::GetterXsYs<int>,double>(label_id,(GetterXsYs<int> *)local_58,height);
  return;
}

Assistant:

void PlotBarsH(const char* label_id, const T* xs, const T* ys, int count, double height, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsHEx(label_id, getter, height);
}